

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

IVec4 __thiscall tcu::getTextureFormatBitDepth(tcu *this,TextureFormat *format)

{
  Channel CVar1;
  TextureSwizzle *pTVar2;
  undefined4 *puVar3;
  int i;
  Channel CVar4;
  long lVar5;
  Channel CVar6;
  Vector<int,_4> *res;
  Channel CVar7;
  undefined4 *puVar8;
  Channel CVar9;
  IVec4 IVar10;
  BVec4 chnMask;
  IVec4 chnBits;
  bool local_4c [4];
  undefined4 local_48 [4];
  undefined4 local_38 [6];
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  getChannelBitDepth(format->type);
  pTVar2 = getChannelReadSwizzle(format->order);
  CVar6 = pTVar2->components[0];
  CVar7 = pTVar2->components[1];
  lVar5 = 0;
  CVar9 = pTVar2->components[2];
  CVar1 = pTVar2->components[3];
  local_4c[0] = CVar6 < CHANNEL_ZERO;
  CVar4 = CHANNEL_0;
  if (CVar6 >= CHANNEL_ZERO) {
    CVar6 = CVar4;
  }
  local_4c[1] = CVar7 < CHANNEL_ZERO;
  if (CVar7 >= CHANNEL_ZERO) {
    CVar7 = CVar4;
  }
  local_4c[2] = CVar9 < CHANNEL_ZERO;
  if (CVar9 >= CHANNEL_ZERO) {
    CVar9 = CVar4;
  }
  local_4c[3] = CVar1 < CHANNEL_ZERO;
  if (CVar1 >= CHANNEL_ZERO) {
    CVar1 = CVar4;
  }
  puVar3 = &local_20;
  local_20 = local_48[(int)CVar6];
  local_1c = local_48[(int)CVar7];
  local_18 = local_48[(int)CVar9];
  local_14 = local_48[(int)CVar1];
  IVar10.m_data._8_8_ = local_38;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  do {
    puVar8 = IVar10.m_data._8_8_;
    if (local_4c[lVar5] != false) {
      puVar8 = puVar3;
    }
    *(undefined4 *)(this + lVar5 * 4) = *puVar8;
    lVar5 = lVar5 + 1;
    IVar10.m_data._8_8_ = IVar10.m_data._8_8_ + 1;
    puVar3 = puVar3 + 1;
  } while (lVar5 != 4);
  IVar10.m_data._0_8_ = this;
  return (IVec4)IVar10.m_data;
}

Assistant:

IVec4 getTextureFormatBitDepth (const TextureFormat& format)
{
	const IVec4						chnBits		= getChannelBitDepth(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const IVec4						chnSwz		= IVec4((chnMask[0]) ? ((int)map[0]) : (0),
														(chnMask[1]) ? ((int)map[1]) : (0),
														(chnMask[2]) ? ((int)map[2]) : (0),
														(chnMask[3]) ? ((int)map[3]) : (0));

	return select(chnBits.swizzle(chnSwz.x(), chnSwz.y(), chnSwz.z(), chnSwz.w()), IVec4(0), chnMask);
}